

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimization.cc
# Opt level: O1

void re2c::minimization(dfa_t *dfa)

{
  pointer ppdVar1;
  pointer ppdVar2;
  pointer ppdVar3;
  dfa_state_t *pdVar4;
  size_t *psVar5;
  size_t *psVar6;
  mapped_type mVar7;
  size_t sVar8;
  int iVar9;
  void *pvVar10;
  opt_t *poVar11;
  long *plVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  mapped_type *pmVar16;
  void *pvVar17;
  void *pvVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_t sVar26;
  long lVar27;
  undefined8 uVar28;
  ulong uVar29;
  pointer ppdVar30;
  size_type __new_size;
  ulong uVar31;
  ulong uVar32;
  unsigned_long uVar33;
  bool bVar34;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>,_bool>
  pVar35;
  pair<re2c::RuleOp_*,_bool> key;
  map<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
  init;
  key_type local_c8;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  long local_a0;
  long local_98;
  long local_90;
  pair<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long> local_88;
  ulong local_70;
  size_t local_68;
  _Rb_tree<std::pair<re2c::RuleOp_*,_bool>,_std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>,_std::_Select1st<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
  local_60;
  
  ppdVar1 = (dfa->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppdVar2 = (dfa->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_70 = (long)ppdVar2 - (long)ppdVar1 >> 3;
  uVar32 = -(ulong)(local_70 >> 0x3d != 0) | (long)ppdVar2 - (long)ppdVar1;
  pvVar10 = operator_new__(uVar32);
  poVar11 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (poVar11->dfa_minimization == DFA_MINIMIZATION_MOORE) {
    sVar8 = dfa->nchars;
    ppdVar30 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppdVar3 = (dfa->states).
              super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar29 = (long)ppdVar3 - (long)ppdVar30;
    uVar15 = (long)uVar29 >> 3;
    if (0x1fffffffffffffff < uVar15) {
      uVar29 = 0xffffffffffffffff;
    }
    pvVar13 = operator_new__(uVar29);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8 = ppdVar3;
    local_b0 = ppdVar30;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppdVar3 != ppdVar30) {
      uVar33 = 0;
      do {
        pdVar4 = (dfa->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar33];
        local_c8.first = pdVar4->rule;
        local_c8.second = pdVar4->ctx;
        local_88.first._9_4_ = local_c8._9_4_;
        local_88.first._13_2_ = local_c8._13_2_;
        local_88.first._15_1_ = local_c8._15_1_;
        local_88.first.first = local_c8.first;
        local_88.first.second = local_c8.second;
        local_88.second = uVar33;
        pVar35 = std::
                 _Rb_tree<std::pair<re2c::RuleOp*,bool>,std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>,std::_Select1st<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>,std::less<std::pair<re2c::RuleOp*,bool>>,std::allocator<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>>
                 ::_M_emplace_unique<std::pair<std::pair<re2c::RuleOp*,bool>,unsigned_long>>
                           ((_Rb_tree<std::pair<re2c::RuleOp*,bool>,std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>,std::_Select1st<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>,std::less<std::pair<re2c::RuleOp*,bool>>,std::allocator<std::pair<std::pair<re2c::RuleOp*,bool>const,unsigned_long>>>
                             *)&local_60,&local_88);
        if (((undefined1  [16])pVar35 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          pmVar16 = std::
                    map<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
                    ::operator[]((map<std::pair<re2c::RuleOp_*,_bool>,_unsigned_long,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
                                  *)&local_60,&local_c8);
          mVar7 = *pmVar16;
          *(mapped_type *)((long)pvVar10 + uVar33 * 8) = mVar7;
          *(undefined8 *)((long)pvVar13 + uVar33 * 8) = *(undefined8 *)((long)pvVar13 + mVar7 * 8);
          *(unsigned_long *)((long)pvVar13 + mVar7 * 8) = uVar33;
        }
        else {
          *(unsigned_long *)((long)pvVar10 + uVar33 * 8) = uVar33;
          *(undefined8 *)((long)pvVar13 + uVar33 * 8) = 0xffffffffffffffff;
        }
        uVar33 = uVar33 + 1;
      } while (uVar15 + (uVar15 == 0) != uVar33);
    }
    uVar23 = uVar15 * sVar8 * 8;
    if (0x1fffffffffffffff < uVar15 * sVar8) {
      uVar23 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar23);
    pvVar18 = operator_new__(uVar29);
    if (local_b8 != local_b0) {
      local_68 = sVar8 * 8;
      ppdVar30 = (dfa->states).
                 super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      lVar21 = 0;
      local_a8 = ppdVar30;
      bVar34 = false;
      do {
        do {
          bVar22 = bVar34;
          lVar14 = lVar21;
          if ((lVar21 == *(long *)((long)pvVar10 + lVar21 * 8)) &&
             (*(long *)((long)pvVar13 + lVar21 * 8) != -1)) {
            lVar20 = lVar21;
            if (lVar21 == -1) {
LAB_00131464:
              bVar34 = false;
            }
            else {
              do {
                if (sVar8 != 0) {
                  psVar5 = ppdVar30[lVar20]->arcs;
                  sVar26 = 0;
                  do {
                    uVar28 = 0xffffffffffffffff;
                    if (psVar5[sVar26] != 0xffffffffffffffff) {
                      uVar28 = *(undefined8 *)((long)pvVar10 + psVar5[sVar26] * 8);
                    }
                    *(undefined8 *)((long)pvVar17 + sVar26 * 8 + lVar20 * sVar8 * 8) = uVar28;
                    sVar26 = sVar26 + 1;
                  } while (sVar8 != sVar26);
                }
                lVar20 = *(long *)((long)pvVar13 + lVar20 * 8);
              } while (lVar20 != -1);
              if (lVar21 == -1) goto LAB_00131464;
              uVar29 = 0;
              local_a0 = lVar21;
              do {
                lVar20 = *(long *)((long)pvVar13 + lVar21 * 8);
                if (uVar29 == 0) {
                  lVar27 = lVar21;
                  lVar21 = lVar20;
                  uVar23 = 0;
                }
                else {
                  lVar19 = lVar21 * sVar8;
                  uVar25 = 0;
                  local_98 = lVar20;
                  local_90 = lVar21;
                  do {
                    lVar20 = *(long *)((long)pvVar18 + uVar25 * 8);
                    iVar9 = bcmp((void *)((long)pvVar17 + lVar19 * 8),
                                 (void *)((long)pvVar17 + lVar20 * sVar8 * 8),local_68);
                    lVar27 = local_90;
                    lVar21 = local_98;
                    ppdVar30 = local_a8;
                    lVar14 = local_a0;
                    if (iVar9 == 0) {
                      *(long *)((long)pvVar10 + local_90 * 8) = lVar20;
                      *(undefined8 *)((long)pvVar13 + local_90 * 8) =
                           *(undefined8 *)((long)pvVar13 + lVar20 * 8);
                      *(long *)((long)pvVar13 + lVar20 * 8) = local_90;
                      uVar23 = uVar25;
                      break;
                    }
                    uVar25 = uVar25 + 1;
                    uVar23 = uVar29;
                  } while (uVar29 != uVar25);
                }
                if (uVar23 == uVar29) {
                  *(long *)((long)pvVar18 + uVar29 * 8) = lVar27;
                  uVar29 = uVar29 + 1;
                  *(long *)((long)pvVar10 + lVar27 * 8) = lVar27;
                  *(undefined8 *)((long)pvVar13 + lVar27 * 8) = 0xffffffffffffffff;
                }
              } while (lVar21 != -1);
              bVar34 = 1 < uVar29;
            }
            bVar22 = (bool)(bVar22 | bVar34);
          }
          lVar21 = lVar14 + 1;
          bVar34 = bVar22;
        } while (lVar21 != uVar15 + (uVar15 == 0));
        if (local_b8 == local_b0) break;
        lVar21 = 0;
        bVar34 = false;
      } while (bVar22);
    }
    operator_delete__(pvVar17);
    operator_delete__(pvVar18);
    operator_delete__(pvVar13);
    std::
    _Rb_tree<std::pair<re2c::RuleOp_*,_bool>,_std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>,_std::_Select1st<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>,_std::less<std::pair<re2c::RuleOp_*,_bool>_>,_std::allocator<std::pair<const_std::pair<re2c::RuleOp_*,_bool>,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
  }
  else if (poVar11->dfa_minimization == DFA_MINIMIZATION_TABLE) {
    uVar15 = dfa->nchars;
    ppdVar30 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppdVar3 = (dfa->states).
              super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar23 = (long)ppdVar3 - (long)ppdVar30 >> 3;
    uVar29 = 0xffffffffffffffff;
    if (uVar23 < 0x2000000000000000) {
      uVar29 = (long)ppdVar3 - (long)ppdVar30;
    }
    plVar12 = (long *)operator_new__(uVar29);
    lVar21 = uVar23 - 1;
    pvVar13 = operator_new__(lVar21 * uVar23 >> 1);
    *plVar12 = (long)pvVar13;
    if (lVar21 != 0) {
      lVar14 = *plVar12;
      lVar20 = 0;
      do {
        lVar14 = lVar14 + lVar20;
        plVar12[lVar20 + 1] = lVar14;
        lVar20 = lVar20 + 1;
      } while (lVar21 != lVar20);
    }
    if (ppdVar3 != ppdVar30) {
      lVar21 = 0;
      do {
        if (lVar21 != 0) {
          pdVar4 = ppdVar30[lVar21];
          lVar14 = plVar12[lVar21];
          lVar20 = 0;
          do {
            bVar34 = true;
            if (pdVar4->ctx == ppdVar30[lVar20]->ctx) {
              bVar34 = pdVar4->rule != ppdVar30[lVar20]->rule;
            }
            *(bool *)(lVar14 + lVar20) = bVar34;
            lVar20 = lVar20 + 1;
          } while (lVar21 != lVar20);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != uVar23 + (uVar23 == 0));
    }
    lVar21 = uVar23 + (uVar23 == 0);
    if (ppdVar3 != ppdVar30) {
      lVar14 = 0;
      bVar34 = false;
      do {
        do {
          bVar22 = bVar34;
          if (lVar14 != 0) {
            lVar20 = plVar12[lVar14];
            lVar27 = 0;
            do {
              if ((uVar15 != 0) && (*(char *)(lVar20 + lVar27) == '\0')) {
                psVar5 = ppdVar30[lVar14]->arcs;
                psVar6 = ppdVar30[lVar27]->arcs;
                uVar29 = 1;
                do {
                  uVar23 = psVar5[uVar29 - 1];
                  uVar25 = psVar6[uVar29 - 1];
                  bVar34 = true;
                  uVar24 = uVar25;
                  if (uVar23 >= uVar25 && uVar23 != uVar25) {
                    uVar24 = uVar23;
                  }
                  uVar31 = uVar25;
                  if (uVar23 < uVar25) {
                    uVar31 = uVar23;
                  }
                  if ((uVar23 != uVar25) &&
                     (((uVar24 == 0xffffffffffffffff || (uVar31 == 0xffffffffffffffff)) ||
                      (*(char *)(plVar12[uVar24] + uVar31) == '\x01')))) {
                    *(undefined1 *)(lVar20 + lVar27) = 1;
                    bVar22 = true;
                    bVar34 = false;
                  }
                } while ((uVar29 < uVar15) && (uVar29 = uVar29 + 1, bVar34));
              }
              lVar27 = lVar27 + 1;
            } while (lVar27 != lVar14);
          }
          lVar14 = lVar14 + 1;
          bVar34 = bVar22;
        } while (lVar14 != lVar21);
        if (ppdVar3 == ppdVar30) break;
        lVar14 = 0;
        bVar34 = false;
      } while (bVar22);
    }
    if (ppdVar3 != ppdVar30) {
      lVar14 = 0;
      do {
        *(long *)((long)pvVar10 + lVar14 * 8) = lVar14;
        if (lVar14 != 0) {
          lVar20 = 0;
          do {
            if (*(char *)(plVar12[lVar14] + lVar20) == '\0') {
              *(long *)((long)pvVar10 + lVar14 * 8) = lVar20;
              break;
            }
            lVar20 = lVar20 + 1;
          } while (lVar14 != lVar20);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar21);
    }
    if ((void *)*plVar12 != (void *)0x0) {
      operator_delete__((void *)*plVar12);
    }
    operator_delete__(plVar12);
  }
  pvVar13 = operator_new__(uVar32);
  if (ppdVar2 != ppdVar1) {
    lVar21 = 0;
    lVar14 = 0;
    do {
      if (lVar21 == *(long *)((long)pvVar10 + lVar21 * 8)) {
        *(long *)((long)pvVar13 + lVar21 * 8) = lVar14;
        lVar14 = lVar14 + 1;
      }
      lVar21 = lVar21 + 1;
    } while (local_70 + (local_70 == 0) != lVar21);
  }
  if (ppdVar2 == ppdVar1) {
    __new_size = 0;
  }
  else {
    lVar21 = local_70 + (local_70 == 0);
    lVar14 = 0;
    __new_size = 0;
    do {
      ppdVar1 = (dfa->states).
                super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar4 = ppdVar1[lVar14];
      if (lVar14 == *(long *)((long)pvVar10 + lVar14 * 8)) {
        if (dfa->nchars != 0) {
          psVar5 = pdVar4->arcs;
          uVar32 = 0;
          do {
            sVar8 = psVar5[uVar32];
            if (sVar8 != 0xffffffffffffffff) {
              psVar5[uVar32] = *(size_t *)((long)pvVar13 + *(long *)((long)pvVar10 + sVar8 * 8) * 8)
              ;
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 < dfa->nchars);
        }
        ppdVar1[__new_size] = pdVar4;
        __new_size = __new_size + 1;
      }
      else if (pdVar4 != (dfa_state_t *)0x0) {
        if (pdVar4->arcs != (size_t *)0x0) {
          operator_delete__(pdVar4->arcs);
        }
        operator_delete(pdVar4,0x18);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar21);
  }
  std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::resize
            (&dfa->states,__new_size);
  operator_delete__(pvVar13);
  operator_delete__(pvVar10);
  return;
}

Assistant:

void minimization(dfa_t &dfa)
{
	const size_t count = dfa.states.size();

	size_t *part = new size_t[count];

	switch (opts->dfa_minimization)
	{
		case DFA_MINIMIZATION_TABLE:
			minimization_table(part, dfa.states, dfa.nchars);
			break;
		case DFA_MINIMIZATION_MOORE:
			minimization_moore(part, dfa.states, dfa.nchars);
			break;
	}

	size_t *compact = new size_t[count];
	for (size_t i = 0, j = 0; i < count; ++i)
	{
		if (i == part[i])
		{
			compact[i] = j++;
		}
	}

	size_t new_count = 0;
	for (size_t i = 0; i < count; ++i)
	{
		dfa_state_t *s = dfa.states[i];
		if (i == part[i])
		{
			size_t *arcs = s->arcs;
			for (size_t c = 0; c < dfa.nchars; ++c)
			{
				if (arcs[c] != dfa_t::NIL)
				{
					arcs[c] = compact[part[arcs[c]]];
				}
			}
			dfa.states[new_count++] = s;
		}
		else
		{
			delete s;
		}
	}
	dfa.states.resize(new_count);

	delete[] compact;
	delete[] part;
}